

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O2

void __thiscall BezierCurve::ConvertToMeter(BezierCurve *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = (this->start)._lat;
  (this->end)._lat = ((this->end)._lat - dVar3) * 111132.95;
  dVar1 = (this->end)._lon;
  dVar2 = (this->start)._lon;
  dVar3 = cos(((double)(~-(ulong)(dVar3 <= 180.0) & (ulong)(dVar3 + -360.0) |
                       (ulong)dVar3 & -(ulong)(dVar3 <= 180.0)) * 3.141592653589793) / 180.0);
  (this->end)._lon = dVar3 * 111132.95 * (dVar1 - dVar2);
  ConvertToMeter(this,&this->ptCtrl);
  return;
}

Assistant:

void BezierCurve::ConvertToMeter ()
{
    end.lat() = Lat2Dist(end.lat() - start.lat());
    end.lon() = Lon2Dist(end.lon() - start.lon(), start.lat());
    ConvertToMeter(ptCtrl);
}